

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase1133::run(TestCase1133 *this)

{
  char cVar1;
  size_t sVar2;
  undefined1 auVar3 [15];
  char *pcVar4;
  char *pcVar5;
  uint i;
  long lVar6;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar7;
  Reader RVar8;
  char *local_190;
  DebugComparison<int,_unsigned_long> _kjCondition;
  char *local_160;
  Orphan<capnp::Text> orphan;
  BuilderFor<capnp::Text> builder;
  MallocMessageBuilder message;
  
  MallocMessageBuilder::MallocMessageBuilder(&message,0x400,GROW_HEURISTICALLY);
  _kjCondition._0_16_ = MessageBuilder::getOrphanage(&message.super_MessageBuilder);
  Orphanage::newOrphan<capnp::Text>(&orphan,(Orphanage *)&_kjCondition,0x11);
  OrphanBuilder::asText(&builder,&orphan.builder);
  memset(builder.content.ptr,0x61,builder.content.size_ - 1);
  AVar7 = MessageBuilder::getSegmentsForOutput(&message.super_MessageBuilder);
  sVar2 = (AVar7.ptr)->size_;
  _kjCondition.left = 4;
  _kjCondition.right = sVar2;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = sVar2 == 4;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_190 = (char *)CONCAT44(local_190._4_4_,4);
    AVar7 = MessageBuilder::getSegmentsForOutput(&message.super_MessageBuilder);
    local_160 = (char *)(AVar7.ptr)->size_;
    kj::_::Debug::
    log<char_const(&)[67],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x473,ERROR,
               "\"failed: expected \" \"(4) == (message.getSegmentsForOutput()[0].size())\", _kjCondition, 4, message.getSegmentsForOutput()[0].size()"
               ,(char (*) [67])"failed: expected (4) == (message.getSegmentsForOutput()[0].size())",
               &_kjCondition,(int *)&local_190,(unsigned_long *)&local_160);
  }
  OrphanBuilder::truncateText(&orphan.builder,0x1b);
  AVar7 = MessageBuilder::getSegmentsForOutput(&message.super_MessageBuilder);
  sVar2 = (AVar7.ptr)->size_;
  _kjCondition.left = 5;
  _kjCondition.right = sVar2;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = sVar2 == 5;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_190 = (char *)CONCAT44(local_190._4_4_,5);
    AVar7 = MessageBuilder::getSegmentsForOutput(&message.super_MessageBuilder);
    local_160 = (char *)(AVar7.ptr)->size_;
    kj::_::Debug::
    log<char_const(&)[67],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x475,ERROR,
               "\"failed: expected \" \"(5) == (message.getSegmentsForOutput()[0].size())\", _kjCondition, 5, message.getSegmentsForOutput()[0].size()"
               ,(char (*) [67])"failed: expected (5) == (message.getSegmentsForOutput()[0].size())",
               &_kjCondition,(int *)&local_190,(unsigned_long *)&local_160);
  }
  RVar8 = OrphanBuilder::asTextReader(&orphan.builder);
  pcVar4 = RVar8.super_StringPtr.content.ptr;
  pcVar5 = (char *)(RVar8.super_StringPtr.content.size_ - 1);
  _kjCondition.result = pcVar5 == (char *)0x1b;
  _kjCondition.left = 0x1b;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (kj::_::Debug::minSeverity < 3 && !_kjCondition.result) {
    local_190 = (char *)CONCAT44(local_190._4_4_,0x1b);
    local_160 = pcVar5;
    _kjCondition.right = (unsigned_long)pcVar5;
    kj::_::Debug::
    log<char_const(&)[41],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x478,ERROR,
               "\"failed: expected \" \"(27) == (reader.size())\", _kjCondition, 27, reader.size()",
               (char (*) [41])"failed: expected (27) == (reader.size())",&_kjCondition,
               (int *)&local_190,(unsigned_long *)&local_160);
  }
  _kjCondition.right = (unsigned_long)pcVar4;
  _kjCondition._0_8_ = builder.content.ptr;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = builder.content.ptr == pcVar4;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_160 = builder.content.ptr;
    local_190 = pcVar4;
    kj::_::Debug::
    log<char_const(&)[55],kj::_::DebugComparison<char*,char_const*>&,char*,char_const*>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x479,ERROR,
               "\"failed: expected \" \"(builder.begin()) == (reader.begin())\", _kjCondition, builder.begin(), reader.begin()"
               ,(char (*) [55])"failed: expected (builder.begin()) == (reader.begin())",
               (DebugComparison<char_*,_const_char_*> *)&_kjCondition,&local_160,&local_190);
  }
  for (lVar6 = 0; lVar6 != 0x11; lVar6 = lVar6 + 1) {
    cVar1 = pcVar4[lVar6];
    _kjCondition.left._1_1_ = cVar1;
    _kjCondition.left._0_1_ = 0x61;
    _kjCondition.right = (unsigned_long)" == ";
    _kjCondition.op.content.ptr = &DAT_00000005;
    _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,cVar1 == 'a');
    if ((cVar1 != 'a') && (kj::_::Debug::minSeverity < 3)) {
      local_160 = (char *)CONCAT71(local_160._1_7_,0x61);
      local_190 = (char *)CONCAT71(local_190._1_7_,pcVar4[lVar6]);
      kj::_::Debug::log<char_const(&)[38],kj::_::DebugComparison<char,char>&,char,char>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x47c,ERROR,
                 "\"failed: expected \" \"(\'a\') == (reader[i])\", _kjCondition, \'a\', reader[i]",
                 (char (*) [38])"failed: expected (\'a\') == (reader[i])",
                 (DebugComparison<char,_char> *)&_kjCondition,(char *)&local_160,(char *)&local_190)
      ;
    }
  }
  for (lVar6 = 0; lVar6 != 10; lVar6 = lVar6 + 1) {
    cVar1 = pcVar4[lVar6 + 0x11];
    auVar3._1_14_ = (undefined1  [14])_kjCondition._2_14_;
    auVar3[0] = cVar1;
    _kjCondition._0_8_ = auVar3._0_8_ << 8;
    _kjCondition.right = (unsigned_long)" == ";
    _kjCondition.op.content.ptr = &DAT_00000005;
    _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,cVar1 == '\0');
    if ((cVar1 != '\0') && (kj::_::Debug::minSeverity < 3)) {
      local_160 = (char *)((ulong)local_160 & 0xffffffffffffff00);
      local_190 = (char *)CONCAT71(local_190._1_7_,pcVar4[lVar6 + 0x11]);
      kj::_::Debug::log<char_const(&)[39],kj::_::DebugComparison<char,char>&,char,char>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x47f,ERROR,
                 "\"failed: expected \" \"(\'\\\\0\') == (reader[i])\", _kjCondition, \'\\0\', reader[i]"
                 ,(char (*) [39])"failed: expected (\'\\0\') == (reader[i])",
                 (DebugComparison<char,_char> *)&_kjCondition,(char *)&local_160,(char *)&local_190)
      ;
    }
  }
  OrphanBuilder::~OrphanBuilder(&orphan.builder);
  MallocMessageBuilder::~MallocMessageBuilder(&message);
  return;
}

Assistant:

TEST(Orphans, ExtendText) {
  MallocMessageBuilder message;
  auto orphan = message.getOrphanage().newOrphan<Text>(17);
  auto builder = orphan.get();
  memset(builder.begin(), 'a', builder.size());

  EXPECT_EQ(4, message.getSegmentsForOutput()[0].size());
  orphan.truncate(27);
  EXPECT_EQ(5, message.getSegmentsForOutput()[0].size());

  auto reader = orphan.getReader();
  EXPECT_EQ(27, reader.size());
  EXPECT_EQ(builder.begin(), reader.begin());

  for (uint i = 0; i < 17; i++) {
    EXPECT_EQ('a', reader[i]);
  }
  for (uint i = 17; i < 27; i++) {
    EXPECT_EQ('\0', reader[i]);
  }
}